

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O2

void __thiscall
compiler::CompilerAstWalker::onExitFunctionDeclarationExpressionAstNode
          (CompilerAstWalker *this,FunctionDeclarationExpressionAstNode *node)

{
  pointer pFVar1;
  pointer pFVar2;
  element_type *peVar3;
  pointer pCVar4;
  size_t sVar5;
  size_t sVar6;
  pointer pVVar7;
  long lVar8;
  pointer pCVar9;
  Function local_d8;
  undefined1 auStack_98 [8];
  vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_> closures;
  _Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_> local_68;
  _Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_> local_48;
  
  closures.super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)node;
  emit(this,LoadUndefinedConstant);
  emit(this,Return);
  pFVar1 = (this->functions).
           super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar2 = (this->functions).
           super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>._M_impl.
           super__Vector_impl_data._M_finish;
  closures.super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_98 = (undefined1  [8])0x0;
  closures.super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  peVar3 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pCVar4 = (peVar3->closures).
           super__Vector_base<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pCVar9 = (peVar3->closures).
                super__Vector_base<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>
                ._M_impl.super__Vector_impl_data._M_start; pCVar9 != pCVar4; pCVar9 = pCVar9 + 1) {
    std::vector<bytecode::ClosureContext,std::allocator<bytecode::ClosureContext>>::
    emplace_back<unsigned_long_const&,unsigned_long_const&>
              ((vector<bytecode::ClosureContext,std::allocator<bytecode::ClosureContext>> *)
               auStack_98,&pCVar9->outerScopeCount,&pCVar9->localScopeIndex);
  }
  sVar5 = closures.
          super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[1].scopeOffsets;
  sVar6 = (closures.
           super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage)->localIndex;
  peVar3 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pVVar7 = (peVar3->variables).
           super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)(peVar3->variables).
                super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
                ._M_impl.super__Vector_impl_data._M_start;
  std::vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>::vector
            ((vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_> *)
             &local_68,
             (vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_> *)
             auStack_98);
  std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::vector
            ((vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_> *)&local_48,
             &((this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->byteCode);
  local_d8.argumentCount = (long)(sVar5 - sVar6) >> 4;
  local_d8.closures.
  super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_start = local_68._M_impl.super__Vector_impl_data._M_start;
  local_d8.closures.
  super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_finish = local_68._M_impl.super__Vector_impl_data._M_finish;
  local_d8.closures.
  super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.byteCode.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
  _M_impl.super__Vector_impl_data._M_start = local_48._M_impl.super__Vector_impl_data._M_start;
  local_d8.byteCode.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
  _M_impl.super__Vector_impl_data._M_finish = local_48._M_impl.super__Vector_impl_data._M_finish;
  local_d8.byteCode.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.localsCount = ((long)pVVar7 - lVar8) / 0x28;
  std::vector<bytecode::Function,_std::allocator<bytecode::Function>_>::
  emplace_back<bytecode::Function>(&this->functions,&local_d8);
  bytecode::Function::~Function(&local_d8);
  std::_Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::~_Vector_base
            (&local_48);
  std::_Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>::
  ~_Vector_base(&local_68);
  popEmissionContext(this);
  emit(this,MakeFn,(long)pFVar2 - (long)pFVar1 >> 6);
  std::_Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>::
  ~_Vector_base((_Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_> *
                )auStack_98);
  return;
}

Assistant:

void onExitFunctionDeclarationExpressionAstNode(FunctionDeclarationExpressionAstNode* node) noexcept override {

    this->emit(bytecode::ByteCodeInstruction::LoadUndefinedConstant);
    this->emit(bytecode::ByteCodeInstruction::Return);

    std::size_t fnIndex = this->functions.size();

    std::vector<bytecode::ClosureContext> closures;

    for (const auto& cc : this->ec->closures) {
      closures.emplace_back(cc.outerScopeCount, cc.localScopeIndex);
    }

    this->functions.emplace_back(bytecode::Function{
      node->parameters.size(),
      this->ec->variables.size(),
      closures,
      this->ec->byteCode
    });

    this->popEmissionContext();

    this->emit(bytecode::ByteCodeInstruction::MakeFn, fnIndex);
  }